

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O0

void sqlcheck::CheckImplicitColumns
               (Configuration *state,string *sql_statement,bool *print_statement)

{
  char *pcVar1;
  allocator local_c1;
  string local_c0;
  string local_a0;
  char *local_80;
  char *message;
  PatternType pattern_type;
  allocator local_61;
  string local_60 [8];
  string title;
  regex pattern;
  bool *print_statement_local;
  string *sql_statement_local;
  Configuration *state_local;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&title.field_2 + 8),
             "(insert into \\S+ values)",0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"Implicit Column Usage",&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  message._0_4_ = 3;
  local_80 = anon_var_dwarf_5ab84;
  std::__cxx11::string::string((string *)&local_a0,local_60);
  pcVar1 = local_80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,pcVar1,&local_c1);
  CheckPattern(state,sql_statement,print_statement,(regex *)((long)&title.field_2 + 8),
               RISK_LEVEL_LOW,PATTERN_TYPE_QUERY,&local_a0,&local_c0,true,0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&title.field_2 + 8));
  return;
}

Assistant:

void CheckImplicitColumns(Configuration& state,
                          const std::string& sql_statement,
                          bool& print_statement){

  std::regex pattern("(insert into \\S+ values)");
  std::string title = "Implicit Column Usage";
  PatternType pattern_type = PatternType::PATTERN_TYPE_QUERY;

  auto message =
      "● Explicitly name columns:  "
      "Although using wildcards and unnamed columns satisfies the goal "
      "of less typing, this habit creates several hazards. "
      "This can break application refactoring and can harm performance. "
      "Always spell out all the columns you need, instead of relying on "
      "wild-cards or implicit column lists.";

  CheckPattern(state,
               sql_statement,
               print_statement,
               pattern,
               RISK_LEVEL_LOW,
               pattern_type,
               title,
               message,
               true);

}